

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_mysql.cpp
# Opt level: O0

QVariant * qTimeFromString(QString *val)

{
  bool bVar1;
  QTime QVar2;
  QVariant *in_RDI;
  long in_FS_OFFSET;
  QVariant *pQVar3;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  QTime local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = in_RDI;
  bVar1 = QString::isEmpty((QString *)0x10be72);
  if (bVar1) {
    QTime::QTime(&local_c);
    QVariant::QVariant(in_RDI,(QTime *)(ulong)(uint)local_c.mds);
  }
  else {
    QVar2 = QTime::fromString((QString *)
                              CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                              (DateFormat)((ulong)pQVar3 >> 0x20));
    QVariant::QVariant(in_RDI,(QTime *)(ulong)(uint)QVar2.mds);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return pQVar3;
  }
  __stack_chk_fail();
}

Assistant:

static inline QVariant qTimeFromString(const QString &val)
{
#if !QT_CONFIG(datestring)
    Q_UNUSED(val);
    return QVariant(val);
#else
    if (val.isEmpty())
        return QVariant(QTime());
    return QVariant(QTime::fromString(val, Qt::ISODate));
#endif
}